

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O3

Expression * __thiscall wasm::PossibleContents::makeExpression(PossibleContents *this,Module *wasm)

{
  __index_type _Var1;
  uintptr_t uVar2;
  Expression *pEVar3;
  Global *pGVar4;
  Expression name;
  Literal local_48;
  Builder local_30;
  Builder builder;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
           + 0x18);
  if ((byte)(_Var1 - 1) < 2) {
    local_30.wasm = wasm;
    if (_Var1 == '\x01') {
      getLiteral(&local_48,this);
      pEVar3 = Builder::makeConstantExpression(&local_30,&local_48);
      Literal::~Literal(&local_48);
    }
    else {
      name = (Expression)getGlobal(this);
      pGVar4 = Module::getGlobal(wasm,(Name)name);
      uVar2 = (pGVar4->type).id;
      pEVar3 = (Expression *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
      pEVar3->_id = GlobalGetId;
      pEVar3[1] = name;
      (pEVar3->type).id = uVar2;
    }
    return pEVar3;
  }
  __assert_fail("canMakeExpression()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.h"
                ,0x136,"Expression *wasm::PossibleContents::makeExpression(Module &)");
}

Assistant:

Expression* makeExpression(Module& wasm) {
    assert(canMakeExpression());
    Builder builder(wasm);
    if (isLiteral()) {
      return builder.makeConstantExpression(getLiteral());
    } else {
      auto name = getGlobal();
      // Note that we load the type from the module, rather than use the type
      // in the GlobalInfo, as that type may not match the global (see comment
      // in the GlobalInfo declaration above).
      return builder.makeGlobalGet(name, wasm.getGlobal(name)->type);
    }
  }